

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPredictorTIFFSubStream.cpp
# Opt level: O1

void __thiscall InputPredictorTIFFSubStream::DecodeBufferToColors(InputPredictorTIFFSubStream *this)

{
  LongBufferSizeType LVar1;
  Byte *pBVar2;
  byte bVar3;
  long lVar4;
  unsigned_short *puVar5;
  uint uVar6;
  LongBufferSizeType LVar7;
  ulong uVar8;
  ulong uVar9;
  Byte j;
  
  bVar3 = this->mBitsPerComponent;
  if (bVar3 == 8) {
    LVar1 = this->mReadColorsCount;
    if (LVar1 != 0) {
      pBVar2 = this->mRowBuffer;
      puVar5 = this->mReadColors;
      LVar7 = 0;
      do {
        puVar5[LVar7] = (ushort)pBVar2[LVar7];
        LVar7 = LVar7 + 1;
      } while (LVar1 != LVar7);
    }
  }
  else {
    LVar1 = this->mReadColorsCount;
    if (bVar3 < 8) {
      if (7 < LVar1 * this->mBitsPerComponent) {
        uVar8 = 0;
        do {
          bVar3 = this->mBitsPerComponent;
          if (bVar3 < 9) {
            uVar9 = 0;
            do {
              pBVar2 = this->mRowBuffer;
              this->mReadColors[(uVar8 * 8 + 8) / (ulong)bVar3 + ~uVar9] =
                   (ushort)pBVar2[uVar8] & this->mBitMask;
              pBVar2[uVar8] = pBVar2[uVar8] >> (bVar3 & 0x1f);
              uVar9 = uVar9 + 1;
              bVar3 = this->mBitsPerComponent;
            } while (uVar9 < (byte)(8 / bVar3));
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)this->mBitsPerComponent * this->mReadColorsCount >> 3);
      }
    }
    else if (LVar1 != 0) {
      pBVar2 = this->mRowBuffer;
      puVar5 = this->mReadColors;
      uVar8 = 0;
      LVar7 = 0;
      do {
        puVar5[LVar7] = 0;
        uVar9 = 0;
        uVar6 = 0;
        do {
          uVar6 = (uint)pBVar2[uVar9 + (uVar8 >> 3)] + ((uVar6 & 0xffff) << (bVar3 & 0x1f));
          puVar5[LVar7] = (unsigned_short)uVar6;
          uVar9 = uVar9 + 1;
        } while (bVar3 >> 3 != uVar9);
        LVar7 = LVar7 + 1;
        uVar8 = uVar8 + bVar3;
      } while (LVar7 != LVar1);
    }
  }
  uVar8 = this->mColors;
  lVar4 = this->mReadColorsCount - uVar8;
  if (uVar8 <= this->mReadColorsCount && lVar4 != 0) {
    puVar5 = this->mReadColors;
    do {
      puVar5[uVar8] = *puVar5 + puVar5[uVar8] & this->mBitMask;
      puVar5 = puVar5 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  this->mReadColorsIndex = this->mReadColors;
  this->mIndexInColor = '\0';
  return;
}

Assistant:

void InputPredictorTIFFSubStream::DecodeBufferToColors()
{	
	//1. Split to colors. Use array of colors (should be columns * colors). Each time take BitsPerComponent of the buffer
	//2. Once you got the "colors", loop the array, setting values after diffs (use modulo of bit mask for "sign" computing)
	//3. Now you have the colors array. 
	LongBufferSizeType i = 0;

	// read the colors differences according to bits per component
	if(8 == mBitsPerComponent)
	{
		for(; i < mReadColorsCount;++i)
			mReadColors[i] = mRowBuffer[i];
	}
	else if(8 > mBitsPerComponent)
	{
		for(; i < (mReadColorsCount*mBitsPerComponent/8);++i)
		{
			for(LongBufferSizeType j=0; j < (LongBufferSizeType)(8/mBitsPerComponent); ++j)
			{
				mReadColors[(i+1)*8/mBitsPerComponent - j - 1] = mRowBuffer[i] & mBitMask;
				mRowBuffer[i] = mRowBuffer[i]>>mBitsPerComponent;
			}
		}
	}
	else // mBitesPerComponent > 8
	{
		for(; i < mReadColorsCount;++i)
		{
			mReadColors[i] = 0;
			for(Byte j=0;j<mBitsPerComponent/8;++j)
				mReadColors[i] = (mReadColors[i]<<mBitsPerComponent) + mRowBuffer[i*mBitsPerComponent/8 + j];
		}
	}

	// calculate color values according to diffs
	for(i = mColors; i < mReadColorsCount; ++i)
		mReadColors[i] = (mReadColors[i] + mReadColors[i-mColors]) & mBitMask;

	mReadColorsIndex = mReadColors;
	mIndexInColor = 0;

}